

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O2

sxi32 jx9CompileSimpleString(jx9_gen_state *pGen,sxi32 iCompileFlag)

{
  uint uVar1;
  SyToken *pValue;
  char *pcVar2;
  jx9_gen_state *pGen_00;
  sxi32 sVar3;
  jx9_value *pObj;
  sxu32 sVar4;
  char *pcVar5;
  char *pcVar6;
  char *pcVar7;
  sxu32 nIdx;
  SyToken *local_40;
  jx9_gen_state *local_38;
  
  pValue = pGen->pIn;
  nIdx = 0;
  pcVar5 = (pValue->sData).zString;
  uVar1 = (pValue->sData).nByte;
  sVar3 = GenStateFindLiteral(pGen,&pValue->sData,&nIdx);
  if (sVar3 == 0) {
    sVar3 = 0;
    jx9VmEmitInstr(pGen->pVm,4,0,nIdx,(void *)0x0,(sxu32 *)0x0);
  }
  else {
    pObj = jx9VmReserveConstObj(pGen->pVm,&nIdx);
    if (pObj == (jx9_value *)0x0) {
      jx9GenCompileError(pGen,1,1,"JX9 engine is running out of memory");
      sVar3 = -10;
    }
    else {
      pcVar7 = pcVar5 + uVar1;
      local_40 = pValue;
      local_38 = pGen;
      jx9MemObjInitFromString(pGen->pVm,pObj,(SyString *)0x0);
      while (pGen_00 = local_38, pcVar5 < pcVar7) {
        sVar4 = 0;
        pcVar2 = pcVar5;
        while ((pcVar6 = pcVar2 + 1, pcVar2 < pcVar7 && (*pcVar2 != '\\'))) {
          sVar4 = sVar4 + 1;
          pcVar2 = pcVar6;
        }
        if (pcVar2 <= pcVar5) {
          pcVar5 = "";
          sVar4 = 0;
        }
        jx9MemObjStringAppend(pObj,pcVar5,sVar4);
        if (pcVar6 < pcVar7) {
          if (*pcVar6 == '\'') {
            pcVar5 = "\'";
LAB_001269c7:
            sVar4 = 1;
          }
          else {
            if (*pcVar6 == '\\') {
              pcVar5 = "\\";
              goto LAB_001269c7;
            }
            sVar4 = 2;
            pcVar5 = pcVar2;
          }
          jx9MemObjStringAppend(pObj,pcVar5,sVar4);
        }
        pcVar5 = pcVar2 + 2;
      }
      sVar3 = 0;
      jx9VmEmitInstr(local_38->pVm,4,0,nIdx,(void *)0x0,(sxu32 *)0x0);
      if ((local_40->sData).nByte < 0x400) {
        GenStateInstallLiteral(pGen_00,pObj,nIdx);
      }
    }
  }
  return sVar3;
}

Assistant:

JX9_PRIVATE sxi32 jx9CompileSimpleString(jx9_gen_state *pGen, sxi32 iCompileFlag)
{
	SyString *pStr = &pGen->pIn->sData; /* Constant string literal */
	const char *zIn, *zCur, *zEnd;
	jx9_value *pObj;
	sxu32 nIdx;
	nIdx = 0; /* Prevent compiler warning */
	/* Delimit the string */
	zIn  = pStr->zString;
	zEnd = &zIn[pStr->nByte];
	if( zIn > zEnd ){
		/* Empty string, load NULL */
		jx9VmEmitInstr(pGen->pVm, JX9_OP_LOADC, 0, 0, 0, 0);
		return SXRET_OK;
	}
	if( SXRET_OK == GenStateFindLiteral(&(*pGen), pStr, &nIdx) ){
		/* Already processed, emit the load constant instruction
		 * and return.
		 */
		jx9VmEmitInstr(pGen->pVm, JX9_OP_LOADC, 0, nIdx, 0, 0);
		return SXRET_OK;
	}
	/* Reserve a new constant */
	pObj = jx9VmReserveConstObj(pGen->pVm, &nIdx);
	if( pObj == 0 ){
		jx9GenCompileError(&(*pGen), E_ERROR, 1, "JX9 engine is running out of memory");
		SXUNUSED(iCompileFlag); /* cc warning */
		return SXERR_ABORT;
	}
	jx9MemObjInitFromString(pGen->pVm, pObj, 0);
	/* Compile the node */
	for(;;){
		if( zIn >= zEnd ){
			/* End of input */
			break;
		}
		zCur = zIn;
		while( zIn < zEnd && zIn[0] != '\\' ){
			zIn++;
		}
		if( zIn > zCur ){
			/* Append raw contents*/
			jx9MemObjStringAppend(pObj, zCur, (sxu32)(zIn-zCur));
		}
		else
		{
			jx9MemObjStringAppend(pObj, "", 0);
		}
		zIn++;
		if( zIn < zEnd ){
			if( zIn[0] == '\\' ){
				/* A literal backslash */
				jx9MemObjStringAppend(pObj, "\\", sizeof(char));
			}else if( zIn[0] == '\'' ){
				/* A single quote */
				jx9MemObjStringAppend(pObj, "'", sizeof(char));
			}else{
				/* verbatim copy */
				zIn--;
				jx9MemObjStringAppend(pObj, zIn, sizeof(char)*2);
				zIn++;
			}
		}
		/* Advance the stream cursor */
		zIn++;
	}
	/* Emit the load constant instruction */
	jx9VmEmitInstr(pGen->pVm, JX9_OP_LOADC, 0, nIdx, 0, 0);
	if( pStr->nByte < 1024 ){
		/* Install in the literal table */
		GenStateInstallLiteral(pGen, pObj, nIdx);
	}
	/* Node successfully compiled */
	return SXRET_OK;
}